

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O2

string * Settings::destFolder_abi_cxx11_(void)

{
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)&dest_folder_str_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string destFolder(){ return dest_folder_str; }